

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCGSolver.cpp
# Opt level: O0

void __thiscall amrex::MLCGSolver::MLCGSolver(MLCGSolver *this,MLMG *a_mlmg,MLLinOp *_lp,Type _typ)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  _func_int **in_RSI;
  MLLinOp *in_RDI;
  int in_stack_ffffffffffffffcc;
  
  in_RDI->_vptr_MLLinOp = in_RSI;
  (in_RDI->info).do_agglomeration = (bool)(char)in_RDX;
  (in_RDI->info).do_consolidation = (bool)(char)((ulong)in_RDX >> 8);
  (in_RDI->info).do_semicoarsening = (bool)(char)((ulong)in_RDX >> 0x10);
  (in_RDI->info).field_0x3 = (char)((ulong)in_RDX >> 0x18);
  (in_RDI->info).agg_grid_size = (int)((ulong)in_RDX >> 0x20);
  (in_RDI->info).con_grid_size = in_ECX;
  *(undefined4 *)&(in_RDI->info).has_metric_term = 0;
  iVar1 = MLLinOp::NMGLevels(in_RDI,in_stack_ffffffffffffffcc);
  (in_RDI->info).max_coarsening_level = iVar1 + -1;
  (in_RDI->info).max_semicoarsening_level = 0;
  (in_RDI->info).semicoarsening_direction = 100;
  (in_RDI->info).hidden_direction = 0;
  in_RDI->verbose = -1;
  return;
}

Assistant:

MLCGSolver::MLCGSolver (MLMG* a_mlmg, MLLinOp& _lp, Type _typ)
    : mlmg(a_mlmg),
      Lp(_lp),
      solver_type(_typ),
      amrlev(0),
      mglev(_lp.NMGLevels(0)-1)
{
    amrex::ignore_unused(mlmg);
}